

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

String __thiscall
testing::internal::XmlUnitTestResultPrinter::TestPropertiesAsXmlAttributes
          (XmlUnitTestResultPrinter *this,TestResult *result)

{
  int iVar1;
  int iVar2;
  Message *pMVar3;
  char *str;
  size_t extraout_RDX;
  String SVar4;
  XmlUnitTestResultPrinter local_58;
  TestProperty *local_30;
  TestProperty *property;
  int i;
  Message attributes;
  TestResult *result_local;
  
  attributes.ss_.ptr_ =
       (scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        )(scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )result;
  Message::Message((Message *)&stack0xffffffffffffffe0);
  property._4_4_ = 0;
  while( true ) {
    iVar1 = property._4_4_;
    iVar2 = TestResult::test_property_count((TestResult *)attributes.ss_.ptr_);
    if (iVar2 <= iVar1) break;
    local_30 = TestResult::GetTestProperty((TestResult *)attributes.ss_.ptr_,property._4_4_);
    pMVar3 = Message::operator<<((Message *)&stack0xffffffffffffffe0,(char (*) [2])0x1f318f);
    local_58.output_file_.length_ = (size_t)TestProperty::key(local_30);
    pMVar3 = Message::operator<<(pMVar3,(char **)&local_58.output_file_.length_);
    pMVar3 = Message::operator<<(pMVar3,(char (*) [2])0x1fca32);
    pMVar3 = Message::operator<<(pMVar3,(char (*) [2])0x1fcce6);
    str = TestProperty::value(local_30);
    EscapeXmlAttribute(&local_58,str);
    pMVar3 = Message::operator<<(pMVar3,(String *)&local_58);
    Message::operator<<(pMVar3,(char (*) [2])0x1fcce6);
    String::~String((String *)&local_58);
    property._4_4_ = property._4_4_ + 1;
  }
  Message::GetString((Message *)this);
  Message::~Message((Message *)&stack0xffffffffffffffe0);
  SVar4.length_ = extraout_RDX;
  SVar4.c_str_ = (char *)this;
  return SVar4;
}

Assistant:

String XmlUnitTestResultPrinter::TestPropertiesAsXmlAttributes(
    const TestResult& result) {
  Message attributes;
  for (int i = 0; i < result.test_property_count(); ++i) {
    const TestProperty& property = result.GetTestProperty(i);
    attributes << " " << property.key() << "="
        << "\"" << EscapeXmlAttribute(property.value()) << "\"";
  }
  return attributes.GetString();
}